

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_file.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::java::
GenerateSibling<google::protobuf::compiler::java::MessageGenerator,google::protobuf::Descriptor>
          (java *this,string *package_dir,string *java_package,Descriptor *descriptor,
          GeneratorContext *context,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *file_list,string *name_suffix,offset_in_MessageGenerator_to_subr pfn)

{
  ZeroCopyOutputStream *output;
  long *plVar1;
  MessageGenerator generator;
  string filename;
  Printer printer;
  
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&generator,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 (java_package->_M_dataplus)._M_p);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&printer,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&generator,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)file_list);
  std::operator+(&filename,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&printer,
                 ".java");
  std::__cxx11::string::~string((string *)&printer);
  std::__cxx11::string::~string((string *)&generator);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)context,&filename);
  output = (ZeroCopyOutputStream *)(**(code **)(*(long *)descriptor + 0x10))(descriptor,&filename);
  io::Printer::Printer(&printer,output,'$');
  io::Printer::Print(&printer,
                     "// Generated by the protocol buffer compiler.  DO NOT EDIT!\n// source: $filename$\n\n"
                     ,"filename",(string *)**(undefined8 **)&java_package->field_2);
  if (package_dir->_M_string_length != 0) {
    io::Printer::Print(&printer,"package $package$;\n\n","package",package_dir);
  }
  MessageGenerator::MessageGenerator(&generator,(Descriptor *)java_package);
  plVar1 = (long *)((long)&generator.descriptor_ + pfn);
  if (((ulong)name_suffix & 1) != 0) {
    name_suffix = *(string **)(*plVar1 + -1 + (long)name_suffix);
  }
  (*(code *)name_suffix)(plVar1,&printer);
  MessageGenerator::~MessageGenerator(&generator);
  io::Printer::~Printer(&printer);
  if (output != (ZeroCopyOutputStream *)0x0) {
    (*output->_vptr_ZeroCopyOutputStream[1])(output);
  }
  std::__cxx11::string::~string((string *)&filename);
  return;
}

Assistant:

static void GenerateSibling(const string& package_dir,
                            const string& java_package,
                            const DescriptorClass* descriptor,
                            GeneratorContext* context,
                            vector<string>* file_list,
                            const string& name_suffix,
                            void (GeneratorClass::*pfn)(io::Printer* printer)) {
  string filename = package_dir + descriptor->name() + name_suffix + ".java";
  file_list->push_back(filename);

  scoped_ptr<io::ZeroCopyOutputStream> output(context->Open(filename));
  io::Printer printer(output.get(), '$');

  printer.Print(
    "// Generated by the protocol buffer compiler.  DO NOT EDIT!\n"
    "// source: $filename$\n"
    "\n",
    "filename", descriptor->file()->name());
  if (!java_package.empty()) {
    printer.Print(
      "package $package$;\n"
      "\n",
      "package", java_package);
  }

  GeneratorClass generator(descriptor);
  (generator.*pfn)(&printer);
}